

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O3

vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> * __thiscall
banksia::TourMng::collectStats
          (vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *__return_storage_ptr__
          ,TourMng *this)

{
  int iVar1;
  ResultType RVar2;
  ReasonType RVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  pointer pMVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  bool bVar11;
  ulong uVar12;
  string name;
  TourPlayer r;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  resultMap;
  key_type local_e0;
  undefined **local_c0;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  _Base_ptr local_88;
  undefined8 uStack_80;
  int local_78;
  vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *local_70;
  pointer local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pMVar7 = (this->matchRecordList).
           super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = (this->matchRecordList).
             super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl
             .super__Vector_impl_data._M_finish;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pMVar7 == local_68) {
    (__return_storage_ptr__->
    super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    local_70 = __return_storage_ptr__;
    do {
      if ((pMVar7->result).result != noresult) {
        bVar11 = false;
        uVar12 = 0;
        bVar6 = true;
        do {
          bVar5 = bVar6;
          pcVar4 = pMVar7->playernames[uVar12]._M_dataplus._M_p;
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,pcVar4,
                     pcVar4 + pMVar7->playernames[uVar12]._M_string_length);
          if (local_e0._M_string_length != 0) {
            local_c0 = &PTR__TourPlayer_001c0228;
            local_b0 = 0;
            local_a8[0] = 0;
            local_88 = (_Base_ptr)0x0;
            uStack_80 = 0;
            local_98 = (_Base_ptr)0x0;
            uStack_90 = (_Base_ptr)0x0;
            local_78 = 0;
            local_b8 = local_a8;
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
                    ::find(&local_60,&local_e0);
            if ((_Rb_tree_header *)iVar8._M_node == &local_60._M_impl.super__Rb_tree_header) {
              std::__cxx11::string::_M_assign((string *)&local_b8);
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_b8);
              local_78 = *(int *)&iVar8._M_node[4]._M_parent;
              local_98 = iVar8._M_node[3]._M_parent;
              uStack_90 = iVar8._M_node[3]._M_left;
              local_88 = iVar8._M_node[3]._M_right;
              uStack_80 = *(undefined8 *)(iVar8._M_node + 4);
            }
            if (pMVar7->playernames[uVar12 ^ 1]._M_string_length == 0) {
              uStack_80 = CONCAT44(uStack_80._4_4_ + 1,(undefined4)uStack_80);
            }
            iVar1 = (int)local_98 + 1;
            local_98 = (_Base_ptr)CONCAT44(local_98._4_4_,iVar1);
            RVar2 = (pMVar7->result).result;
            if (RVar2 == loss) {
              if (bVar5) {
LAB_0015f0ec:
                local_98 = (_Base_ptr)CONCAT44(local_98._4_4_ + 1,iVar1);
              }
              else {
LAB_0015f0c0:
                uStack_90 = (_Base_ptr)CONCAT44(uStack_90._4_4_ + 1,(int)uStack_90);
                RVar3 = (pMVar7->result).reason;
                if ((RVar3 < (crash|mate)) && ((0x580U >> (RVar3 & 0x1f) & 1) != 0)) {
                  local_88 = (_Base_ptr)CONCAT44(local_88._4_4_,(int)local_88 + 1);
                }
              }
            }
            else if (RVar2 == draw) {
              uStack_90 = (_Base_ptr)CONCAT44(uStack_90._4_4_,(int)uStack_90 + 1);
            }
            else if (RVar2 == win) {
              if (bVar11) goto LAB_0015f0ec;
              goto LAB_0015f0c0;
            }
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
                                   *)&local_60,&local_e0);
            std::__cxx11::string::_M_assign((string *)&pmVar9->name);
            pmVar9->whiteCnt = local_78;
            *(_Base_ptr *)&pmVar9->abnormalCnt = local_88;
            pmVar9->flag = (undefined4)uStack_80;
            pmVar9->byeCnt = uStack_80._4_4_;
            pmVar9->gameCnt = (int)local_98;
            pmVar9->winCnt = local_98._4_4_;
            pmVar9->drawCnt = (int)uStack_90;
            pmVar9->lossCnt = uStack_90._4_4_;
            local_c0 = &PTR__TourPlayer_001c0228;
            if (local_b8 != local_a8) {
              operator_delete(local_b8);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
          uVar12 = 1;
          bVar11 = true;
          bVar6 = false;
        } while (bVar5);
      }
      __return_storage_ptr__ = local_70;
      pMVar7 = pMVar7 + 1;
    } while (pMVar7 != local_68);
    (local_70->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_70->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_70->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &local_60._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::push_back
                (__return_storage_ptr__,(value_type *)(p_Var10 + 2));
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_banksia::TourPlayer>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::vector<TourPlayer> TourMng::collectStats() const
{
    std::map<std::string, TourPlayer> resultMap;
    
    for(auto && m : matchRecordList) {
        if (m.result.result == ResultType::noresult) { // hm ?
            continue;
        }
        
        for(int sd = 0; sd < 2; sd++) {
            auto name = m.playernames[sd];
            if (name.empty()) { // bye players (in knockout) won without opponents
                continue;
            }
            
            TourPlayer r;
            auto it = resultMap.find(name);
            if (it == resultMap.end()) {
                r.name = name;
            } else {
                r = it->second; assert(r.name == name);
            }
            
            if (m.playernames[1 - sd].empty()) { // bye player
                r.byeCnt++;
            }
            
            auto lossCnt = r.lossCnt;
            r.gameCnt++;
            switch (m.result.result) {
                case ResultType::win:
                    if (sd == W) r.winCnt++; else r.lossCnt++;
                    break;
                case ResultType::draw:
                    r.drawCnt++;
                    break;
                case ResultType::loss:
                    if (sd == B) r.winCnt++; else r.lossCnt++;
                    break;
                default:
                    assert(false);
                    break;
            }
            
            if (lossCnt < r.lossCnt) {
                if (m.result.reason == ReasonType::illegalmove || m.result.reason == ReasonType::crash || m.result.reason == ReasonType::timeout) {
                    r.abnormalCnt++;
                }
            }
            resultMap[name] = r;
        }
    }
    
    std::vector<TourPlayer> resultList;
    for (auto && s : resultMap) {
        resultList.push_back(s.second);
    }
    return resultList;
}